

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O0

void __thiscall Shell::parseAssertReturn(Shell *this,Element *s)

{
  Literals LVar1;
  Literals LVar2;
  bool bVar3;
  size_t sVar4;
  __shared_ptr_access<wasm::SExpressionWasmBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  element_type *peVar5;
  Element *s_00;
  ostream *poVar6;
  ostream *poVar7;
  ostream *poVar8;
  undefined7 in_stack_fffffffffffffc68;
  undefined1 in_stack_fffffffffffffc6f;
  undefined8 in_stack_fffffffffffffc70;
  undefined8 in_stack_fffffffffffffc78;
  undefined8 in_stack_fffffffffffffc80;
  undefined1 in_stack_fffffffffffffc90 [16];
  Fatal local_318;
  Literals local_190;
  Literals local_158;
  TrapException *anon_var_0;
  WasmException *e;
  byte local_d1;
  undefined1 local_d0 [7];
  bool trapped;
  undefined1 local_88 [8];
  Literals expected;
  Literals actual;
  Element *s_local;
  Shell *this_local;
  
  ::wasm::Literals::Literals
            ((Literals *)
             &expected.super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ::wasm::Literals::Literals((Literals *)local_88);
  sVar4 = ::wasm::Element::size(s);
  if (2 < sVar4) {
    this_00 = (__shared_ptr_access<wasm::SExpressionWasmBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::
                 map<wasm::Name,_std::shared_ptr<wasm::SExpressionWasmBuilder>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::SExpressionWasmBuilder>_>_>_>
                 ::operator[](&this->builders,&this->lastModule);
    peVar5 = std::
             __shared_ptr_access<wasm::SExpressionWasmBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_00);
    ::wasm::Element::operator[]((uint)s);
    ::wasm::SExpressionWasmBuilder::parseExpression((Element *)peVar5);
    ::wasm::getLiteralsFromConstExpression((Expression *)local_d0);
    ::wasm::Literals::operator=((Literals *)local_88,(Literals *)local_d0);
    ::wasm::Literals::~Literals((Literals *)local_d0);
  }
  local_d1 = 0;
  s_00 = (Element *)::wasm::Element::operator[]((uint)s);
  parseOperation((Literals *)&e,this,s_00);
  ::wasm::Literals::operator=
            ((Literals *)
             &expected.super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(Literals *)&e);
  ::wasm::Literals::~Literals((Literals *)&e);
  if (((local_d1 ^ 0xff) & 1) == 0) {
    __assert_fail("!trapped",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-shell.cpp"
                  ,0xe5,"void Shell::parseAssertReturn(Element &)");
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"seen ");
  ::wasm::Literals::Literals
            (&local_158,
             (Literals *)
             &expected.super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  LVar1.super_SmallVector<wasm::Literal,_1UL>.usedFixed._7_1_ = in_stack_fffffffffffffc6f;
  LVar1.super_SmallVector<wasm::Literal,_1UL>.usedFixed._0_7_ = in_stack_fffffffffffffc68;
  LVar1.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 =
       in_stack_fffffffffffffc70;
  LVar1.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
  _M_str = (char *)in_stack_fffffffffffffc78;
  LVar1.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = in_stack_fffffffffffffc80;
  LVar1.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)poVar6;
  LVar1.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_fffffffffffffc90._0_8_;
  LVar1.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_fffffffffffffc90._8_8_;
  poVar7 = (ostream *)::wasm::operator<<(poVar6,LVar1);
  poVar8 = std::operator<<(poVar7,", expected ");
  ::wasm::Literals::Literals(&local_190,(Literals *)local_88);
  LVar2.super_SmallVector<wasm::Literal,_1UL>.usedFixed._7_1_ = in_stack_fffffffffffffc6f;
  LVar2.super_SmallVector<wasm::Literal,_1UL>.usedFixed._0_7_ = in_stack_fffffffffffffc68;
  LVar2.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 =
       in_stack_fffffffffffffc70;
  LVar2.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
  _M_str = (char *)poVar8;
  LVar2.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = (uintptr_t)poVar7;
  LVar2.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)poVar6;
  LVar2.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_fffffffffffffc90._0_8_;
  LVar2.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_fffffffffffffc90._8_8_;
  poVar6 = (ostream *)::wasm::operator<<(poVar8,LVar2);
  std::operator<<(poVar6,'\n');
  ::wasm::Literals::~Literals(&local_190);
  ::wasm::Literals::~Literals(&local_158);
  bVar3 = ::wasm::SmallVector<wasm::Literal,_1UL>::operator!=
                    ((SmallVector<wasm::Literal,_1UL> *)local_88,
                     (SmallVector<wasm::Literal,_1UL> *)
                     &expected.super_SmallVector<wasm::Literal,_1UL>.flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  if (!bVar3) {
    ::wasm::Literals::~Literals((Literals *)local_88);
    ::wasm::Literals::~Literals
              ((Literals *)
               &expected.super_SmallVector<wasm::Literal,_1UL>.flexible.
                super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    return;
  }
  ::wasm::Fatal::Fatal(&local_318);
  ::wasm::Fatal::operator<<(&local_318,(char (*) [33])"unexpected, should be identical\n");
  ::wasm::Fatal::~Fatal(&local_318);
}

Assistant:

void parseAssertReturn(Element& s) {
    Literals actual;
    Literals expected;
    if (s.size() >= 3) {
      expected = getLiteralsFromConstExpression(
        builders[lastModule]->parseExpression(*s[2]));
    }
    [[maybe_unused]] bool trapped = false;
    try {
      actual = parseOperation(*s[1]);
    } catch (const TrapException&) {
      trapped = true;
    } catch (const WasmException& e) {
      std::cout << "[exception thrown: " << e << "]" << std::endl;
      trapped = true;
    }
    assert(!trapped);
    std::cerr << "seen " << actual << ", expected " << expected << '\n';
    if (expected != actual) {
      Fatal() << "unexpected, should be identical\n";
    }
  }